

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InsertOrReplaceNode(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,KeyNode *node)

{
  NodeBase *pNVar1;
  NodeBase **ppNVar2;
  bool bVar3;
  NodeBase *node_00;
  uint64_t uVar4;
  uintptr_t v_1;
  map_index_t b;
  ulong uVar5;
  long lVar6;
  uint64_t v;
  NodeAndBucket NVar7;
  ViewType k;
  
  k._M_str = (char *)node[1].super_NodeBase.next;
  k._M_len = (size_t)node[2].super_NodeBase.next;
  NVar7 = FindHelper(this,k);
  node_00 = NVar7.node;
  b = NVar7.bucket;
  if (node_00 == (NodeBase *)0x0) {
    bVar3 = ResizeIfLoadIsOutOfRange(this,(ulong)((this->super_UntypedMapBase).num_elements_ + 1));
    if (bVar3) {
      pNVar1 = node[2].super_NodeBase.next;
      uVar4 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                        (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                         node[1].super_NodeBase.next,pNVar1);
      uVar5 = (uVar4 ^ (ulong)pNVar1) * -0x234dd359734ecb13;
      ppNVar2 = (this->super_UntypedMapBase).table_;
      uVar5 = ((uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
               uVar5 << 0x38) ^ (ulong)ppNVar2) * -0x234dd359734ecb13;
      lVar6 = ((uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 |
                (uVar5 & 0xff0000000000) >> 0x18 | (uVar5 & 0xff00000000) >> 8 |
                (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 |
               uVar5 << 0x38) ^ (ulong)ppNVar2) * -0x234dd359734ecb13;
      b = ((uint)(byte)((ulong)lVar6 >> 0x38) | ((uint)((ulong)lVar6 >> 0x20) & 0xff0000) >> 8 |
           (uint)((ulong)lVar6 >> 0x18) & 0xff0000 | (uint)((ulong)lVar6 >> 8) & 0xff000000) &
          (this->super_UntypedMapBase).num_buckets_ - 1;
    }
  }
  else {
    EraseImpl(this,b,(KeyNode *)node_00,true);
  }
  InsertUnique(this,b,node);
  (this->super_UntypedMapBase).num_elements_ = (this->super_UntypedMapBase).num_elements_ + 1;
  return node_00 == (NodeBase *)0x0;
}

Assistant:

bool InsertOrReplaceNode(KeyNode* node) {
    bool is_new = true;
    auto p = this->FindHelper(node->key());
    map_index_t b = p.bucket;
    if (ABSL_PREDICT_FALSE(p.node != nullptr)) {
      EraseImpl(p.bucket, static_cast<KeyNode*>(p.node), true);
      is_new = false;
    } else if (ResizeIfLoadIsOutOfRange(num_elements_ + 1)) {
      b = BucketNumber(node->key());  // bucket_number
    }
    InsertUnique(b, node);
    ++num_elements_;
    return is_new;
  }